

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall
gss::innards::Proof::create_injectivity_constraints(Proof *this,int pattern_size,int target_size)

{
  bool bVar1;
  pointer pIVar2;
  ostream *poVar3;
  pointer ppVar4;
  int in_EDX;
  int in_ESI;
  pair<std::_Rb_tree_iterator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  pVar5;
  long n;
  iterator x;
  int p;
  stringstream injectivity_constraint;
  int v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  ostream *in_stack_fffffffffffffd38;
  map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  long local_2a8;
  string local_270 [32];
  _Base_ptr local_250;
  undefined1 local_248;
  long local_220;
  map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_218;
  long local_1e8;
  _Self local_1e0 [3];
  pair<int,_int> local_1c8;
  pair<long,_long> local_1c0;
  _Self local_1b0;
  int local_1a4;
  stringstream local_1a0 [16];
  ostream local_190 [380];
  int local_14;
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  for (local_14 = 0; local_14 < local_10; local_14 = local_14 + 1) {
    pIVar2 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x13b663);
    poVar3 = std::operator<<((ostream *)&pIVar2->field_0x50,"* injectivity on value ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
    std::operator<<(poVar3,'\n');
    std::__cxx11::stringstream::stringstream(local_1a0);
    for (local_1a4 = 0; local_1a4 < local_c; local_1a4 = local_1a4 + 1) {
      std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
      operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  *)0x13b6cc);
      std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_1c8,&local_1a4,&local_14);
      std::pair<long,_long>::pair<int,_int,_true>(&local_1c0,&local_1c8);
      local_1b0._M_node =
           (_Base_ptr)
           std::
           map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffd28,(key_type *)0x13b71f);
      std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
      operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  *)0x13b73d);
      local_1e0[0]._M_node =
           (_Base_ptr)
           std::
           map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffd28);
      bVar1 = std::operator==(&local_1b0,local_1e0);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        poVar3 = std::operator<<(local_190,"-1 x");
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)0x13b799);
        poVar3 = std::operator<<(poVar3,(string *)&ppVar4->second);
        std::operator<<(poVar3," ");
      }
    }
    std::operator<<(local_190,">= -1");
    pIVar2 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x13b817);
    local_1e8 = pIVar2->nb_constraints + 1;
    pIVar2->nb_constraints = local_1e8;
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x13b83e);
    pIVar2 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x13b853);
    if ((pIVar2->recover_encoding & 1U) == 0) {
      local_2a8 = local_1e8;
    }
    else {
      local_2a8 = 0;
    }
    local_220 = local_2a8;
    std::__cxx11::stringstream::str();
    this_00 = &local_218;
    std::
    tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    tuple<long_&,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              ((tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this_00,(long *)in_stack_fffffffffffffd38,(long *)in_stack_fffffffffffffd30,
               in_stack_fffffffffffffd28);
    pVar5 = std::
            map<long,std::tuple<long,long,std::__cxx11::string>,std::less<long>,std::allocator<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>>
            ::emplace<int&,std::tuple<long,long,std::__cxx11::string>>
                      (this_00,(int *)in_stack_fffffffffffffd38,
                       (tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffd30);
    local_250 = (_Base_ptr)pVar5.first._M_node;
    local_248 = pVar5.second;
    std::
    tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple((tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x13b907);
    std::__cxx11::string::~string(in_stack_fffffffffffffd30);
    pIVar2 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x13b91e);
    in_stack_fffffffffffffd38 = (ostream *)&pIVar2->field_0x50;
    std::__cxx11::stringstream::str();
    in_stack_fffffffffffffd30 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::operator<<(in_stack_fffffffffffffd38,local_270);
    std::operator<<((ostream *)in_stack_fffffffffffffd30," ;\n");
    std::__cxx11::string::~string(in_stack_fffffffffffffd30);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return;
}

Assistant:

auto Proof::create_injectivity_constraints(int pattern_size, int target_size) -> void
{
    for (int v = 0; v < target_size; ++v) {
        _imp->model_stream << "* injectivity on value " << v << '\n';
        stringstream injectivity_constraint;

        for (int p = 0; p < pattern_size; ++p) {
            auto x = _imp->variable_mappings.find(pair{p, v});
            if (x != _imp->variable_mappings.end())
                injectivity_constraint << "-1 x" << x->second << " ";
        }
        injectivity_constraint << ">= -1";
        long n = ++_imp->nb_constraints;
        _imp->injectivity_constraints.emplace(v, tuple{n, _imp->recover_encoding ? 0 : n, injectivity_constraint.str()});
        _imp->model_stream << injectivity_constraint.str() << " ;\n";
    }
}